

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

int yaml_parser_fetch_plain_scalar(yaml_parser_t *parser)

{
  size_t *psVar1;
  yaml_token_t **tail;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined1 (*pauVar6) [16];
  yaml_char_t **ppyVar7;
  ulong uVar8;
  size_t sVar9;
  byte *pbVar10;
  char *pcVar11;
  byte bVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  undefined8 *puVar16;
  undefined1 __s [8];
  yaml_token_t *pyVar17;
  byte bVar18;
  yaml_mark_t start_mark;
  yaml_mark_t end_mark;
  yaml_token_t token;
  undefined1 local_148 [8];
  undefined1 (*pauStack_140) [16];
  undefined1 (*local_138 [2]) [16];
  undefined1 local_128 [8];
  undefined1 (*pauStack_120) [16];
  undefined1 (*local_118 [2]) [16];
  undefined1 (*local_108) [16];
  undefined1 (*pauStack_100) [16];
  undefined1 (*apauStack_f8 [2]) [16];
  undefined1 local_e8 [8];
  undefined1 (*pauStack_e0) [16];
  undefined1 (*local_d8 [2]) [16];
  size_t local_c8;
  size_t sStack_c0;
  size_t local_b8;
  size_t local_a8;
  size_t sStack_a0;
  size_t local_98;
  undefined1 local_88 [8];
  undefined1 (*pauStack_80) [16];
  long local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  size_t local_68;
  size_t sStack_60;
  size_t local_58;
  size_t local_50;
  size_t sStack_48;
  size_t local_40;
  
  bVar18 = 0;
  iVar4 = yaml_parser_save_simple_key(parser);
  if (iVar4 == 0) {
    return 0;
  }
  parser->simple_key_allowed = 0;
  pauStack_100 = (undefined1 (*) [16])0x0;
  apauStack_f8[0] = (undefined1 (*) [16])0x0;
  local_118[0] = (undefined1 (*) [16])0x0;
  _local_128 = (undefined1  [16])0x0;
  local_138[0] = (undefined1 (*) [16])0x0;
  _local_148 = (undefined1  [16])0x0;
  local_d8[0] = (undefined1 (*) [16])0x0;
  _local_e8 = (undefined1  [16])0x0;
  iVar4 = parser->indent;
  local_108 = (undefined1 (*) [16])yaml_malloc(0x10);
  if (local_108 != (undefined1 (*) [16])0x0) {
    pauStack_100 = local_108 + 1;
    *local_108 = (undefined1  [16])0x0;
    apauStack_f8[0] = local_108;
    pauVar6 = (undefined1 (*) [16])yaml_malloc(0x10);
    local_128 = (undefined1  [8])pauVar6;
    if (pauVar6 != (undefined1 (*) [16])0x0) {
      pauStack_120 = pauVar6 + 1;
      *pauVar6 = (undefined1  [16])0x0;
      local_118[0] = pauVar6;
      pauVar6 = (undefined1 (*) [16])yaml_malloc(0x10);
      local_148 = (undefined1  [8])pauVar6;
      if (pauVar6 != (undefined1 (*) [16])0x0) {
        pauStack_140 = pauVar6 + 1;
        *pauVar6 = (undefined1  [16])0x0;
        local_138[0] = pauVar6;
        pauVar6 = (undefined1 (*) [16])yaml_malloc(0x10);
        local_e8 = (undefined1  [8])pauVar6;
        if (pauVar6 != (undefined1 (*) [16])0x0) {
          pauStack_e0 = pauVar6 + 1;
          *pauVar6 = (undefined1  [16])0x0;
          local_98 = (parser->mark).column;
          local_a8 = (parser->mark).index;
          sStack_a0 = (parser->mark).line;
          local_c8 = (parser->mark).index;
          sStack_c0 = (parser->mark).line;
          local_b8 = (parser->mark).column;
          bVar3 = false;
          local_d8[0] = pauVar6;
LAB_00112f33:
          if ((parser->unread < 4) && (iVar5 = yaml_parser_update_buffer(parser,4), iVar5 == 0))
          goto LAB_00113b0e;
          pbVar10 = (parser->buffer).pointer;
          bVar12 = *pbVar10;
          if ((parser->mark).column == 0) {
            if (bVar12 == 0x2d) {
              if ((pbVar10[1] != 0x2d) || (pbVar10[2] != 0x2d)) goto LAB_00112f72;
            }
            else {
              if (bVar12 != 0x2e) goto joined_r0x00112f6c;
              if ((pbVar10[1] != 0x2e) || (pbVar10[2] != 0x2e)) goto LAB_00112f72;
            }
            bVar2 = pbVar10[3];
            if (bVar2 == 0xc2) {
              if (pbVar10[4] == 0x85) goto LAB_001139d1;
            }
            else if (((bVar2 != 0xe2) && (bVar2 < 0x21)) &&
                    ((0x100002601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) goto LAB_001139d1;
          }
          else {
joined_r0x00112f6c:
            if (bVar12 == 0x23) goto LAB_001139d1;
          }
LAB_00112f72:
          do {
            uVar15 = (uint)bVar12;
            if (bVar12 == 0xc2) {
              if (pbVar10[1] == 0x85) goto LAB_001133a6;
            }
            else if ((bVar12 != 0xe2) && (bVar12 < 0x21)) {
              if ((0x100002600U >> ((ulong)uVar15 & 0x3f) & 1) != 0) goto LAB_001133a6;
              if ((ulong)uVar15 == 0) goto LAB_001139d1;
            }
            if (parser->flow_level == 0) {
              if (bVar12 == 0x3a) {
                bVar12 = pbVar10[1];
LAB_00113017:
                if (bVar12 == 0xc2) {
                  if (pbVar10[2] == 0x85) goto LAB_001139d1;
                }
                else if (((bVar12 != 0xe2) && (bVar12 < 0x21)) &&
                        ((0x100002601U >> ((ulong)(uint)bVar12 & 0x3f) & 1) != 0))
                goto LAB_001139d1;
              }
            }
            else {
              uVar13 = bVar12 - 0x2c;
              if (uVar13 < 0x32) {
                if ((ulong)uVar13 == 0xe) {
                  bVar12 = pbVar10[1];
                  if (((0x3e < bVar12 - 0x3f) ||
                      ((0x5000000050000001U >> ((ulong)(bVar12 - 0x3f) & 0x3f) & 1) == 0)) &&
                     (bVar12 != 0x2c)) goto LAB_00113017;
                  parser->error = YAML_SCANNER_ERROR;
                  parser->context = "while scanning a plain scalar";
                  (parser->context_mark).index = local_c8;
                  (parser->context_mark).line = sStack_c0;
                  (parser->context_mark).column = local_b8;
                  pcVar11 = "found unexpected \':\'";
                  goto LAB_00113b95;
                }
                if ((0x2800000080001U >> ((ulong)uVar13 & 0x3f) & 1) != 0) goto LAB_001139d1;
              }
              if ((uVar15 == 0x7b) || (bVar12 == 0x7d)) goto LAB_001139d1;
            }
            if (bVar3) {
              if (*(yaml_char_t *)local_128 == '\n') {
                if (*(yaml_char_t *)local_148 == '\0') {
                  pauVar6 = apauStack_f8[0];
                  if ((pauStack_100 <= (undefined1 (*) [16])(*apauStack_f8[0] + 5)) &&
                     (iVar5 = yaml_string_extend((yaml_char_t **)&local_108,
                                                 (yaml_char_t **)apauStack_f8,
                                                 (yaml_char_t **)&pauStack_100),
                     pauVar6 = apauStack_f8[0], iVar5 == 0)) break;
                  apauStack_f8[0] = (undefined1 (*) [16])(*pauVar6 + 1);
                  (*pauVar6)[0] = 0x20;
                }
                else {
                  iVar5 = yaml_string_join((yaml_char_t **)&local_108,(yaml_char_t **)apauStack_f8,
                                           (yaml_char_t **)&pauStack_100,(yaml_char_t **)local_148,
                                           (yaml_char_t **)local_138,(yaml_char_t **)(local_148 + 8)
                                          );
                  if (iVar5 == 0) break;
                  local_138[0] = (undefined1 (*) [16])local_148;
                  memset((void *)local_148,0,(long)pauStack_140 - (long)local_148);
                }
                local_118[0] = (undefined1 (*) [16])local_128;
                ppyVar7 = (yaml_char_t **)(local_128 + 8);
                __s = local_128;
              }
              else {
                iVar5 = yaml_string_join((yaml_char_t **)&local_108,(yaml_char_t **)apauStack_f8,
                                         (yaml_char_t **)&pauStack_100,(yaml_char_t **)local_128,
                                         (yaml_char_t **)local_118,(yaml_char_t **)(local_128 + 8));
                if (iVar5 == 0) break;
                local_118[0] = (undefined1 (*) [16])local_128;
                ppyVar7 = (yaml_char_t **)(local_148 + 8);
                iVar5 = yaml_string_join((yaml_char_t **)&local_108,(yaml_char_t **)apauStack_f8,
                                         (yaml_char_t **)&pauStack_100,(yaml_char_t **)local_148,
                                         (yaml_char_t **)local_138,ppyVar7);
                if (iVar5 == 0) break;
                local_118[0] = (undefined1 (*) [16])local_128;
                memset((void *)local_128,0,(long)pauStack_120 - (long)local_128);
                local_138[0] = (undefined1 (*) [16])local_148;
                __s = local_148;
              }
LAB_0011322b:
              memset((void *)__s,0,(long)*ppyVar7 - (long)__s);
            }
            else if (local_e8 != (undefined1  [8])local_d8[0]) {
              iVar5 = yaml_string_join((yaml_char_t **)&local_108,(yaml_char_t **)apauStack_f8,
                                       (yaml_char_t **)&pauStack_100,(yaml_char_t **)local_e8,
                                       (yaml_char_t **)local_d8,(yaml_char_t **)(local_e8 + 8));
              if (iVar5 != 0) {
                local_d8[0] = (undefined1 (*) [16])local_e8;
                ppyVar7 = (yaml_char_t **)(local_e8 + 8);
                __s = local_e8;
                goto LAB_0011322b;
              }
              break;
            }
            if ((pauStack_100 <= (undefined1 (*) [16])(*apauStack_f8[0] + 5)) &&
               (iVar5 = yaml_string_extend((yaml_char_t **)&local_108,(yaml_char_t **)apauStack_f8,
                                           (yaml_char_t **)&pauStack_100), iVar5 == 0)) break;
            pbVar10 = (parser->buffer).pointer;
            bVar12 = *pbVar10;
            if ((char)bVar12 < '\0') {
              if ((bVar12 & 0xe0) == 0xc0) {
LAB_001132e3:
                (parser->buffer).pointer = pbVar10 + 1;
                (*apauStack_f8[0])[0] = *pbVar10;
                pbVar10 = (parser->buffer).pointer;
                apauStack_f8[0] = (undefined1 (*) [16])(*apauStack_f8[0] + 1);
                goto LAB_00113307;
              }
              if ((bVar12 & 0xf0) == 0xe0) {
LAB_001132bf:
                (parser->buffer).pointer = pbVar10 + 1;
                (*apauStack_f8[0])[0] = *pbVar10;
                pbVar10 = (parser->buffer).pointer;
                apauStack_f8[0] = (undefined1 (*) [16])(*apauStack_f8[0] + 1);
                goto LAB_001132e3;
              }
              if ((bVar12 & 0xf8) == 0xf0) {
                (parser->buffer).pointer = pbVar10 + 1;
                (*apauStack_f8[0])[0] = *pbVar10;
                pbVar10 = (parser->buffer).pointer;
                apauStack_f8[0] = (undefined1 (*) [16])(*apauStack_f8[0] + 1);
                goto LAB_001132bf;
              }
            }
            else {
LAB_00113307:
              (parser->buffer).pointer = pbVar10 + 1;
              (*apauStack_f8[0])[0] = *pbVar10;
              apauStack_f8[0] = (undefined1 (*) [16])(*apauStack_f8[0] + 1);
            }
            (parser->mark).index = (parser->mark).index + 1;
            psVar1 = &(parser->mark).column;
            *psVar1 = *psVar1 + 1;
            uVar8 = parser->unread - 1;
            parser->unread = uVar8;
            local_98 = (parser->mark).column;
            local_a8 = (parser->mark).index;
            sStack_a0 = (parser->mark).line;
            if ((uVar8 < 2) && (iVar5 = yaml_parser_update_buffer(parser,2), iVar5 == 0))
            goto LAB_00113b0e;
            pbVar10 = (parser->buffer).pointer;
            bVar12 = *pbVar10;
            bVar3 = false;
          } while( true );
        }
      }
    }
  }
LAB_00113b08:
  parser->error = YAML_MEMORY_ERROR;
LAB_00113b0e:
  yaml_free(local_108);
  apauStack_f8[0] = (undefined1 (*) [16])0x0;
  local_108 = (undefined1 (*) [16])0x0;
  pauStack_100 = (undefined1 (*) [16])0x0;
  yaml_free((void *)local_128);
  local_118[0] = (undefined1 (*) [16])0x0;
  _local_128 = (undefined1  [16])0x0;
  yaml_free((void *)local_148);
  local_138[0] = (undefined1 (*) [16])0x0;
  _local_148 = (undefined1  [16])0x0;
  yaml_free((void *)local_e8);
  return 0;
LAB_001133a6:
  sVar9 = parser->unread;
  do {
    while( true ) {
      if ((sVar9 == 0) && (iVar5 = yaml_parser_update_buffer(parser,1), iVar5 == 0))
      goto LAB_00113b0e;
      pbVar10 = (parser->buffer).pointer;
      bVar12 = *pbVar10;
      if (0x1f < bVar12) break;
      if (bVar12 != 9) {
        if ((bVar12 == 10) || (bVar12 == 0xd)) goto LAB_00113564;
        goto LAB_001139b7;
      }
LAB_001134b7:
      if (bVar3) {
        sVar9 = (parser->mark).column;
        if (bVar12 == 9 && (int)sVar9 <= iVar4) {
          parser->error = YAML_SCANNER_ERROR;
          parser->context = "while scanning a plain scalar";
          (parser->context_mark).index = local_c8;
          (parser->context_mark).line = sStack_c0;
          (parser->context_mark).column = local_b8;
          pcVar11 = "found a tab character that violate indentation";
LAB_00113b95:
          parser->problem = pcVar11;
          sVar9 = (parser->mark).line;
          (parser->problem_mark).index = (parser->mark).index;
          (parser->problem_mark).line = sVar9;
          (parser->problem_mark).column = (parser->mark).column;
          goto LAB_00113b0e;
        }
        (parser->mark).index = (parser->mark).index + 1;
        (parser->mark).column = sVar9 + 1;
        parser->unread = parser->unread - 1;
        bVar12 = *pbVar10;
        lVar14 = 1;
        if ((((char)bVar12 < '\0') && (lVar14 = 2, (bVar12 & 0xe0) != 0xc0)) &&
           (lVar14 = 3, (bVar12 & 0xf0) != 0xe0)) {
          lVar14 = (ulong)((bVar12 & 0xf8) == 0xf0) << 2;
        }
        (parser->buffer).pointer = pbVar10 + lVar14;
        goto LAB_00113540;
      }
      if (*local_d8[0] + 5 < pauStack_e0) {
LAB_0011382b:
        (parser->buffer).pointer = pbVar10 + 1;
        (*local_d8[0])[0] = *pbVar10;
        local_d8[0] = (undefined1 (*) [16])(*local_d8[0] + 1);
      }
      else {
        iVar5 = yaml_string_extend((yaml_char_t **)local_e8,(yaml_char_t **)local_d8,
                                   (yaml_char_t **)(local_e8 + 8));
        if (iVar5 == 0) goto LAB_00113b08;
        pbVar10 = (parser->buffer).pointer;
        bVar12 = *pbVar10;
        if (-1 < (char)bVar12) goto LAB_0011382b;
        if ((bVar12 & 0xe0) == 0xc0) {
LAB_00113807:
          (parser->buffer).pointer = pbVar10 + 1;
          (*local_d8[0])[0] = *pbVar10;
          pbVar10 = (parser->buffer).pointer;
          local_d8[0] = (undefined1 (*) [16])(*local_d8[0] + 1);
          goto LAB_0011382b;
        }
        if ((bVar12 & 0xf0) == 0xe0) {
LAB_001137e3:
          (parser->buffer).pointer = pbVar10 + 1;
          (*local_d8[0])[0] = *pbVar10;
          pbVar10 = (parser->buffer).pointer;
          local_d8[0] = (undefined1 (*) [16])(*local_d8[0] + 1);
          goto LAB_00113807;
        }
        if ((bVar12 & 0xf8) == 0xf0) {
          (parser->buffer).pointer = pbVar10 + 1;
          (*local_d8[0])[0] = *pbVar10;
          pbVar10 = (parser->buffer).pointer;
          local_d8[0] = (undefined1 (*) [16])(*local_d8[0] + 1);
          goto LAB_001137e3;
        }
      }
      (parser->mark).index = (parser->mark).index + 1;
      psVar1 = &(parser->mark).column;
      *psVar1 = *psVar1 + 1;
      sVar9 = parser->unread - 1;
      parser->unread = sVar9;
      bVar3 = false;
    }
    if (bVar12 == 0x20) goto LAB_001134b7;
    if (((bVar12 == 0xe2) || (bVar12 != 0xc2)) || (pbVar10[1] != 0x85)) break;
LAB_00113564:
    if ((parser->unread < 2) && (iVar5 = yaml_parser_update_buffer(parser,2), iVar5 == 0))
    goto LAB_00113b0e;
    if (bVar3) {
      if ((pauStack_140 <= *local_138[0] + 5) &&
         (iVar5 = yaml_string_extend((yaml_char_t **)local_148,(yaml_char_t **)local_138,
                                     (yaml_char_t **)(local_148 + 8)), iVar5 == 0))
      goto LAB_00113b08;
      pauVar6 = local_138[0];
      pbVar10 = (parser->buffer).pointer;
      bVar12 = *pbVar10;
      if (bVar12 < 0xc2) {
        if (bVar12 != 10) {
          if (bVar12 != 0xd) goto LAB_00113540;
          if (pbVar10[1] == 10) {
            local_138[0] = (undefined1 (*) [16])(*local_138[0] + 1);
            goto LAB_0011367c;
          }
        }
        local_138[0] = (undefined1 (*) [16])(*local_138[0] + 1);
LAB_00113940:
        (*pauVar6)[0] = 10;
        ppyVar7 = &(parser->buffer).pointer;
        *ppyVar7 = *ppyVar7 + 1;
        goto LAB_0011396f;
      }
      if ((bVar12 == 0xc2) && (pbVar10[1] == 0x85)) {
        local_138[0] = (undefined1 (*) [16])(*local_138[0] + 1);
        goto LAB_00113964;
      }
LAB_00113540:
      sVar9 = parser->unread;
    }
    else {
      local_d8[0] = (undefined1 (*) [16])local_e8;
      memset((void *)local_e8,0,(long)pauStack_e0 - (long)local_e8);
      if ((pauStack_120 <= *local_118[0] + 5) &&
         (iVar5 = yaml_string_extend((yaml_char_t **)local_128,(yaml_char_t **)local_118,
                                     (yaml_char_t **)(local_128 + 8)), iVar5 == 0))
      goto LAB_00113b08;
      pbVar10 = (parser->buffer).pointer;
      bVar12 = *pbVar10;
      pauVar6 = local_118[0];
      if (bVar12 < 0xc2) {
        if (bVar12 == 10) {
LAB_00113937:
          local_118[0] = (undefined1 (*) [16])(*local_118[0] + 1);
          goto LAB_00113940;
        }
        if (bVar12 != 0xd) goto LAB_00113540;
        if (pbVar10[1] != 10) goto LAB_00113937;
        local_118[0] = (undefined1 (*) [16])(*local_118[0] + 1);
LAB_0011367c:
        (*pauVar6)[0] = 10;
        ppyVar7 = &(parser->buffer).pointer;
        *ppyVar7 = *ppyVar7 + 2;
        (parser->mark).column = 0;
        (parser->mark).index = (parser->mark).index + 2;
        (parser->mark).line = (parser->mark).line + 1;
        sVar9 = parser->unread - 2;
      }
      else {
        if ((bVar12 != 0xc2) || (pbVar10[1] != 0x85)) goto LAB_00113540;
        local_118[0] = (undefined1 (*) [16])(*local_118[0] + 1);
LAB_00113964:
        (*pauVar6)[0] = 10;
        ppyVar7 = &(parser->buffer).pointer;
        *ppyVar7 = *ppyVar7 + 2;
LAB_0011396f:
        (parser->mark).column = 0;
        (parser->mark).index = (parser->mark).index + 1;
        (parser->mark).line = (parser->mark).line + 1;
        sVar9 = parser->unread - 1;
      }
      parser->unread = sVar9;
    }
    bVar3 = true;
  } while( true );
LAB_001139b7:
  if ((parser->flow_level == 0) && ((int)(parser->mark).column <= iVar4)) {
LAB_001139d1:
    stack0xffffffffffffff7c = SUB1612((undefined1  [16])0x0,4);
    local_88._0_4_ = 0x15;
    local_68 = local_c8;
    sStack_60 = sStack_c0;
    local_58 = local_b8;
    local_50 = local_a8;
    sStack_48 = sStack_a0;
    local_40 = local_98;
    pauStack_80 = local_108;
    uStack_70 = 1;
    local_78 = (long)apauStack_f8[0] - (long)local_108;
    uStack_6c = 0;
    if (bVar3) {
      parser->simple_key_allowed = 1;
    }
    yaml_free((void *)local_128);
    local_118[0] = (undefined1 (*) [16])0x0;
    _local_128 = (undefined1  [16])0x0;
    yaml_free((void *)local_148);
    local_138[0] = (undefined1 (*) [16])0x0;
    _local_148 = (undefined1  [16])0x0;
    yaml_free((void *)local_e8);
    tail = &(parser->tokens).tail;
    pyVar17 = (parser->tokens).tail;
    if (pyVar17 == (parser->tokens).end) {
      iVar4 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,tail,
                                &(parser->tokens).end);
      if (iVar4 == 0) {
        parser->error = YAML_MEMORY_ERROR;
        yaml_token_delete((yaml_token_t *)local_88);
        return 0;
      }
      pyVar17 = *tail;
    }
    *tail = pyVar17 + 1;
    puVar16 = (undefined8 *)local_88;
    for (lVar14 = 10; lVar14 != 0; lVar14 = lVar14 + -1) {
      *(undefined8 *)pyVar17 = *puVar16;
      puVar16 = puVar16 + (ulong)bVar18 * -2 + 1;
      pyVar17 = (yaml_token_t *)((long)pyVar17 + (ulong)bVar18 * -0x10 + 8);
    }
    return 1;
  }
  goto LAB_00112f33;
}

Assistant:

static int
yaml_parser_fetch_plain_scalar(yaml_parser_t *parser)
{
    yaml_token_t token;

    /* A plain scalar could be a simple key. */

    if (!yaml_parser_save_simple_key(parser))
        return 0;

    /* A simple key cannot follow a flow scalar. */

    parser->simple_key_allowed = 0;

    /* Create the SCALAR token and append it to the queue. */

    if (!yaml_parser_scan_plain_scalar(parser, &token))
        return 0;

    if (!ENQUEUE(parser, parser->tokens, token)) {
        yaml_token_delete(&token);
        return 0;
    }

    return 1;
}